

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall soul::AST::Scope::NameSearch::addResult(NameSearch *this,ASTObject *o)

{
  bool bVar1;
  pool_ref<soul::AST::ASTObject> local_20;
  ASTObject *local_18;
  ASTObject *o_local;
  NameSearch *this_local;
  
  local_18 = o;
  o_local = (ASTObject *)this;
  bVar1 = contains<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,8ul>,soul::AST::ASTObject&>
                    (&this->itemsFound,o);
  if (!bVar1) {
    pool_ref<soul::AST::ASTObject>::pool_ref<soul::AST::ASTObject,void>(&local_20,local_18);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::push_back
              (&this->itemsFound,&local_20);
    pool_ref<soul::AST::ASTObject>::~pool_ref(&local_20);
  }
  return;
}

Assistant:

void addResult (ASTObject& o)
            {
                if (! contains (itemsFound, o))
                    itemsFound.push_back (o);
            }